

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::Reset
          (DeadReckoningCalculator *this,Vector *LinearVelocity,Vector *LinearAcceleration,
          Vector *AngularVelocity,WorldCoordinates *Position,EulerAngles *Orientation,
          Vector *QuatAxis,DeadReckoningAlgorithm DRA)

{
  bool bVar1;
  KFLOAT64 KVar2;
  KFLOAT32 KVar3;
  KFLOAT32 KVar4;
  KFLOAT32 KVar5;
  Vector local_60;
  DataTypeBase local_48;
  undefined8 local_40;
  KFLOAT32 local_38;
  
  this->m_DRA = DRA;
  KVar2 = Position->m_f64Y;
  (this->m_initPosition).m_f64X = Position->m_f64X;
  (this->m_initPosition).m_f64Y = KVar2;
  (this->m_initPosition).m_f64Z = Position->m_f64Z;
  KVar3 = DATA_TYPE::Vector::GetX(QuatAxis);
  KVar4 = DATA_TYPE::Vector::GetY(QuatAxis);
  KVar5 = DATA_TYPE::Vector::GetZ(QuatAxis);
  bVar1 = 0.0 < (float)KVar5 + (float)KVar4 + (float)KVar3;
  if (bVar1) {
    (this->m_quatAxis).m_f32Z = QuatAxis->m_f32Z;
    KVar3 = QuatAxis->m_f32Y;
    (this->m_quatAxis).m_f32X = QuatAxis->m_f32X;
    (this->m_quatAxis).m_f32Y = KVar3;
  }
  this->m_bQuaxAxisSet = bVar1;
  orientationReset(this,Orientation);
  angularVelocityReset(this,AngularVelocity);
  (this->m_initLinearVelocity).m_f32Z = LinearVelocity->m_f32Z;
  KVar3 = LinearVelocity->m_f32Y;
  (this->m_initLinearVelocity).m_f32X = LinearVelocity->m_f32X;
  (this->m_initLinearVelocity).m_f32Y = KVar3;
  KVar3 = LinearAcceleration->m_f32Y;
  (this->m_initLinearAcceleration).m_f32X = LinearAcceleration->m_f32X;
  (this->m_initLinearAcceleration).m_f32Y = KVar3;
  (this->m_initLinearAcceleration).m_f32Z = LinearAcceleration->m_f32Z;
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
            (&local_60,&this->m_SkewOmegaMatrix,&this->m_initLinearVelocity);
  DATA_TYPE::Vector::operator+(&this->m_initLinearAcceleration,&local_60);
  (this->m_Ab).m_f32Z = local_38;
  (this->m_Ab).m_f32X = (KFLOAT32)(undefined4)local_40;
  (this->m_Ab).m_f32Y = (KFLOAT32)local_40._4_4_;
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_48);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_60.super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::Reset( const Vector & LinearVelocity, const Vector & LinearAcceleration, const Vector & AngularVelocity,
                                     const WorldCoordinates & Position, const EulerAngles & Orientation, const Vector & QuatAxis, DeadReckoningAlgorithm DRA )
{
    m_DRA = DRA;

    positionReset( Position );
    if ((QuatAxis.GetX() + QuatAxis.GetY() + QuatAxis.GetZ()) > 0.0f) // must set m_bQuaxAxisSet before orientationReset
        quatAxisReset(QuatAxis);
    else
        m_bQuaxAxisSet = false;
    orientationReset( Orientation );
    angularVelocityReset( AngularVelocity );
    velocityReset( LinearVelocity );
    accelerationReset( LinearAcceleration );

    m_Ab = ( m_initLinearAcceleration + ( m_SkewOmegaMatrix * m_initLinearVelocity ) );
}